

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O0

btScalar btEpsRoot(void)

{
  if (!btEpsRoot::alreadyCalculated) {
    btMachEps();
    btEpsRoot::epsroot = btSqrt(0.0);
    btEpsRoot::alreadyCalculated = true;
  }
  return btEpsRoot::epsroot;
}

Assistant:

btScalar btEpsRoot() {
	
	static btScalar epsroot = 0.;
	static bool alreadyCalculated = false;
	
	if (!alreadyCalculated) {
		epsroot = btSqrt(btMachEps());
		alreadyCalculated = true;
	}
	return epsroot;
}